

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O3

void create_symbol_table(void)

{
  bucket **ppbVar1;
  int iVar2;
  long lVar3;
  bucket *pbVar4;
  
  symbol_table = (bucket **)malloc(0x2000);
  if (symbol_table == (bucket **)0x0) {
    no_space();
  }
  lVar3 = 0;
  do {
    symbol_table[lVar3] = (bucket *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  pbVar4 = make_bucket("error");
  pbVar4->index = 1;
  pbVar4->class = '\x01';
  ppbVar1 = symbol_table;
  last_symbol = pbVar4;
  first_symbol = pbVar4;
  iVar2 = hash("error");
  ppbVar1[iVar2] = pbVar4;
  return;
}

Assistant:

void create_symbol_table()
{
    register int i;
    register bucket *bp;

    symbol_table = (bucket **) MALLOC(TABLE_SIZE*sizeof(bucket *));
    if (symbol_table == 0) no_space();
    for (i = 0; i < TABLE_SIZE; i++)
	symbol_table[i] = 0;

    bp = make_bucket("error");
    bp->index = 1;
    bp->class = TERM;

    first_symbol = bp;
    last_symbol = bp;
    symbol_table[hash("error")] = bp;
}